

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O1

void test_dt_integer(void)

{
  char cVar1;
  XSValue_Data expValue;
  XSValue_Data expValue_00;
  XSValue_Data expValue_01;
  ulong uVar2;
  char cVar3;
  bool bVar4;
  XSValue_Data *pXVar5;
  XSValue *pXVar6;
  wchar16 *pwVar7;
  char *pcVar8;
  long lVar9;
  int iVar10;
  void *pvVar11;
  char *pcVar12;
  Status myStatus;
  Status myStatus_14;
  char lex_iv_2 [8];
  char lex_iv_1 [10];
  char data_canrep_2 [6];
  char data_canrep_1 [6];
  char data_rawstr_2 [9];
  char lex_v_ran64_iv_2 [21];
  char lex_v_ran64_iv_1 [21];
  char lex_v_ran64_v_2 [21];
  char lex_v_ran64_v_1 [21];
  char data_rawstr_1 [14];
  char lex_v_ran_v_1 [13];
  char lex_v_ran64_iv_1_canrep [20];
  char lex_v_ran64_v_1_canrep [20];
  char lex_v_ran64_iv_2_canrep [21];
  char lex_v_ran64_v_2_canrep [21];
  StrX local_268;
  char *local_258;
  Status local_24c;
  char local_248 [8];
  undefined8 local_240;
  undefined2 local_238;
  char local_230 [8];
  char local_228 [8];
  ulong local_220;
  char local_218 [16];
  char local_208 [32];
  char local_1e8 [32];
  char local_1c8 [32];
  char local_1a8 [32];
  char local_188 [16];
  char local_178 [16];
  char local_168 [32];
  char local_148 [32];
  char local_128 [32];
  char local_108 [24];
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  builtin_strncpy(local_178 + 8,"   \n",5);
  builtin_strncpy(local_178,"   1234 ",8);
  builtin_strncpy(local_1a8,"+9223372036854775807",0x15);
  builtin_strncpy(local_1c8,"-9223372036854775808",0x15);
  builtin_strncpy(local_1e8,"+9223372036854775808",0x15);
  builtin_strncpy(local_208 + 0x10,"5809",5);
  builtin_strncpy(local_208,"-922337203685477",0x10);
  builtin_strncpy(local_148,"9223372036854775807",0x14);
  builtin_strncpy(local_108 + 0x10,"5808",5);
  builtin_strncpy(local_108,"-922337203685477",0x10);
  builtin_strncpy(local_168,"9223372036854775808",0x14);
  builtin_strncpy(local_128 + 0x10,"5809",5);
  builtin_strncpy(local_128,"-922337203685477",0x10);
  local_240 = 0x35342e3433623231;
  local_238 = 0x36;
  builtin_strncpy(local_248,"1234b56",8);
  builtin_strncpy(local_188 + 8,"5   \n",6);
  builtin_strncpy(local_188,"   +1234",8);
  builtin_strncpy(local_228,"12345",6);
  builtin_strncpy(local_218,"00012345",9);
  builtin_strncpy(local_230,"12345",6);
  local_258 = (char *)((ulong)local_258 & 0xffffffff00000000);
  local_268.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_178,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_268.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_178,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XSValue::validate
                    (local_268.fUnicodeForm,dt_integer,(Status *)&local_258,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_268);
  if (cVar3 == '\0') {
    StrX::StrX(&local_268,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x557,local_178,local_268.fLocalForm,1);
    StrX::~StrX(&local_268);
    errSeen = 1;
  }
  local_258 = (char *)((ulong)local_258 & 0xffffffff00000000);
  local_268.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_1a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_268.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_1a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XSValue::validate
                    (local_268.fUnicodeForm,dt_integer,(Status *)&local_258,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_268);
  if (cVar3 == '\0') {
    StrX::StrX(&local_268,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x558,local_1a8,local_268.fLocalForm,1);
    StrX::~StrX(&local_268);
    errSeen = 1;
  }
  local_258 = (char *)((ulong)local_258 & 0xffffffff00000000);
  local_268.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_1c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_268.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_1c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XSValue::validate
                    (local_268.fUnicodeForm,dt_integer,(Status *)&local_258,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_268);
  if (cVar3 == '\0') {
    StrX::StrX(&local_268,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x559,local_1c8,local_268.fLocalForm,1);
    StrX::~StrX(&local_268);
    errSeen = 1;
  }
  local_258 = (char *)((ulong)local_258 & 0xffffffff00000000);
  local_268.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_1e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_268.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_1e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XSValue::validate
                    (local_268.fUnicodeForm,dt_integer,(Status *)&local_258,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_268);
  if (cVar3 == '\0') {
    StrX::StrX(&local_268,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x55a,local_1e8,local_268.fLocalForm,1);
    StrX::~StrX(&local_268);
    errSeen = 1;
  }
  local_258 = (char *)((ulong)local_258 & 0xffffffff00000000);
  local_268.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_208,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_268.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_208,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XSValue::validate
                    (local_268.fUnicodeForm,dt_integer,(Status *)&local_258,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_268);
  if (cVar3 == '\0') {
    StrX::StrX(&local_268,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x55b,local_208,local_268.fLocalForm,1);
    StrX::~StrX(&local_268);
    errSeen = 1;
  }
  local_258 = (char *)((ulong)local_258 & 0xffffffff00000000);
  local_268.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         ((char *)&local_240,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_268.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ((char *)&local_240,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XSValue::validate
                    (local_268.fUnicodeForm,dt_integer,(Status *)&local_258,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_268);
  if (cVar3 == '\0') {
    if ((int)local_258 != 6) {
      StrX::StrX(&local_268,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      if (((ulong)local_258 & 0xffffffff) < 0xb) {
        pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_258 & 0xffffffff];
      }
      else {
        pcVar12 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x55e,&local_240,local_268.fLocalForm,"st_FOCA0002",pcVar12);
      goto LAB_0010aaf1;
    }
  }
  else {
    StrX::StrX(&local_268,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x55e,&local_240,local_268.fLocalForm,0);
LAB_0010aaf1:
    StrX::~StrX(&local_268);
    errSeen = 1;
  }
  local_258 = (char *)((ulong)local_258 & 0xffffffff00000000);
  local_268.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_248,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_268.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_248,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XSValue::validate
                    (local_268.fUnicodeForm,dt_integer,(Status *)&local_258,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_268);
  if (cVar3 == '\0') {
    if ((int)local_258 == 6) goto LAB_0010abfa;
    StrX::StrX(&local_268,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
    if (((ulong)local_258 & 0xffffffff) < 0xb) {
      pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_258 & 0xffffffff];
    }
    else {
      pcVar12 = "st_UnknownType";
    }
    printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0x55f,local_248,local_268.fLocalForm,"st_FOCA0002",pcVar12);
  }
  else {
    StrX::StrX(&local_268,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x55f,local_248,local_268.fLocalForm,0);
  }
  StrX::~StrX(&local_268);
  errSeen = 1;
LAB_0010abfa:
  iVar10 = 1;
  do {
    local_258 = (char *)((ulong)local_258 & 0xffffffff00000000);
    local_268.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_178,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_268.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_178,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar11 = (void *)0x1f;
    pXVar5 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_268.fUnicodeForm,dt_integer,(Status *)&local_258,ver_10,iVar10 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_268);
    if (pXVar5 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_268,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x57c,local_178);
      StrX::~StrX(&local_268);
      errSeen = 1;
    }
    else {
      uStack_98 = 0x4d2;
      local_80 = local_38;
      local_90 = local_48;
      uStack_88 = uStack_40;
      expValue.fValue.f_long = 0x4d2;
      expValue._0_8_ = local_a0;
      expValue.fValue._8_8_ = local_48;
      expValue.fValue._16_8_ = uStack_40;
      expValue.fValue.f_datetime.f_milisec = (double)local_38;
      bVar4 = compareActualValue(dt_integer,*pXVar5,expValue);
      if (!bVar4) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar11);
    }
    local_258 = (char *)((ulong)local_258 & 0xffffffff00000000);
    local_268.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_268.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar11 = (void *)0x1f;
    pXVar5 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_268.fUnicodeForm,dt_integer,(Status *)&local_258,ver_10,iVar10 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_268);
    if (pXVar5 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_268,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x57e,local_1a8);
      StrX::~StrX(&local_268);
      errSeen = 1;
    }
    else {
      uStack_c0 = 0x7fffffffffffffff;
      local_a8 = local_50;
      local_b8 = local_60;
      uStack_b0 = uStack_58;
      expValue_00.fValue.f_long = 0x7fffffffffffffff;
      expValue_00._0_8_ = local_c8;
      expValue_00.fValue._8_8_ = local_60;
      expValue_00.fValue._16_8_ = uStack_58;
      expValue_00.fValue.f_datetime.f_milisec = (double)local_50;
      bVar4 = compareActualValue(dt_integer,*pXVar5,expValue_00);
      if (!bVar4) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar11);
    }
    local_258 = (char *)((ulong)local_258 & 0xffffffff00000000);
    local_268.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_268.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar11 = (void *)0x1f;
    pXVar5 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_268.fUnicodeForm,dt_integer,(Status *)&local_258,ver_10,iVar10 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_268);
    if (pXVar5 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_268,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x57f,local_1c8);
      StrX::~StrX(&local_268);
      errSeen = 1;
    }
    else {
      uStack_e8 = 0x8000000000000000;
      local_d0 = local_68;
      local_e0 = local_78;
      uStack_d8 = uStack_70;
      expValue_01.fValue.f_long = 0x8000000000000000;
      expValue_01._0_8_ = local_f0;
      expValue_01.fValue._8_8_ = local_78;
      expValue_01.fValue._16_8_ = uStack_70;
      expValue_01.fValue.f_datetime.f_milisec = (double)local_68;
      bVar4 = compareActualValue(dt_integer,*pXVar5,expValue_01);
      if (!bVar4) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar11);
    }
    local_258 = (char *)((ulong)local_258 & 0xffffffff00000000);
    local_268.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_268.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_268.fUnicodeForm,dt_integer,(Status *)&local_258,ver_10,iVar10 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_268);
    if (pXVar6 == (XSValue *)0x0) {
      if ((int)local_258 != 8) {
        StrX::StrX(&local_268,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
        pcVar12 = "st_UnknownType";
        if (((ulong)local_258 & 0xffffffff) < 0xb) {
          pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_258 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x580,local_1e8,local_268.fLocalForm,"st_FOCA0003",pcVar12);
        StrX::~StrX(&local_268);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_268,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      pvVar11 = (void *)0x580;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x580,local_1e8);
      StrX::~StrX(&local_268);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar6);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar11);
    }
    local_258 = (char *)((ulong)local_258 & 0xffffffff00000000);
    local_268.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_208,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_268.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_208,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_268.fUnicodeForm,dt_integer,(Status *)&local_258,ver_10,iVar10 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_268);
    if (pXVar6 == (XSValue *)0x0) {
      if ((int)local_258 != 8) {
        StrX::StrX(&local_268,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
        pcVar12 = "st_UnknownType";
        if (((ulong)local_258 & 0xffffffff) < 0xb) {
          pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_258 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x581,local_208,local_268.fLocalForm,"st_FOCA0003",pcVar12);
        StrX::~StrX(&local_268);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_268,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      pvVar11 = (void *)0x581;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x581,local_208);
      StrX::~StrX(&local_268);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar6);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar11);
    }
    local_258 = (char *)((ulong)local_258 & 0xffffffff00000000);
    local_268.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_240,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_268.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_240,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_268.fUnicodeForm,dt_integer,(Status *)&local_258,ver_10,iVar10 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_268);
    if (pXVar6 == (XSValue *)0x0) {
      if ((int)local_258 != 6) {
        StrX::StrX(&local_268,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
        pcVar12 = "st_UnknownType";
        if (((ulong)local_258 & 0xffffffff) < 0xb) {
          pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_258 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x583,&local_240,local_268.fLocalForm,"st_FOCA0002",pcVar12);
        StrX::~StrX(&local_268);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_268,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      pvVar11 = (void *)0x583;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x583,&local_240);
      StrX::~StrX(&local_268);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar6);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar11);
    }
    local_258 = (char *)((ulong)local_258 & 0xffffffff00000000);
    local_268.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_248,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_268.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_248,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_268.fUnicodeForm,dt_integer,(Status *)&local_258,ver_10,iVar10 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_268);
    if (pXVar6 == (XSValue *)0x0) {
      if ((int)local_258 != 6) {
        StrX::StrX(&local_268,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
        pcVar12 = "st_UnknownType";
        if (((ulong)local_258 & 0xffffffff) < 0xb) {
          pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_258 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x584,local_248,local_268.fLocalForm,"st_FOCA0002",pcVar12);
        StrX::~StrX(&local_268);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_268,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      pvVar11 = (void *)0x584;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x584,local_248);
      StrX::~StrX(&local_268);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar6);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar11);
    }
    iVar10 = iVar10 + -1;
  } while (iVar10 == 0);
  local_220 = 0;
  do {
    iVar10 = (int)local_220;
    local_24c = st_Init;
    local_268.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_188,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_268.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_188,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_268.fUnicodeForm,dt_integer,&local_24c,ver_10,iVar10 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_268);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_268,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x5a2,local_188);
      StrX::~StrX(&local_268);
      errSeen = 1;
      iVar10 = (int)local_220;
    }
    else {
      local_258 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar12 = local_228;
      iVar10 = (int)local_220;
      if (local_258 != pcVar12) {
        pcVar8 = local_258;
        if (local_258 == (char *)0x0) {
LAB_0010b556:
          if (*pcVar12 == '\0') goto LAB_0010b5a6;
        }
        else {
          do {
            cVar3 = *pcVar8;
            if (cVar3 == '\0') goto LAB_0010b556;
            pcVar8 = pcVar8 + 1;
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar3 == cVar1);
        }
        StrX::StrX(&local_268,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x5a2,local_188,local_268.fLocalForm,local_258,local_228);
        StrX::~StrX(&local_268);
        errSeen = 1;
      }
LAB_0010b5a6:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release(&local_258,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_24c = st_Init;
    local_268.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_218,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_268.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_218,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_268.fUnicodeForm,dt_integer,&local_24c,ver_10,iVar10 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_268);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_268,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x5a3,local_218);
      StrX::~StrX(&local_268);
      errSeen = 1;
    }
    else {
      local_258 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar12 = local_230;
      if (local_258 != pcVar12) {
        pcVar8 = local_258;
        if (local_258 == (char *)0x0) {
LAB_0010b6a9:
          if (*pcVar12 == '\0') goto LAB_0010b6f9;
        }
        else {
          do {
            cVar3 = *pcVar8;
            if (cVar3 == '\0') goto LAB_0010b6a9;
            pcVar8 = pcVar8 + 1;
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar3 == cVar1);
        }
        StrX::StrX(&local_268,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x5a3,local_218,local_268.fLocalForm,local_258,local_230);
        StrX::~StrX(&local_268);
        errSeen = 1;
      }
LAB_0010b6f9:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release(&local_258,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_24c = st_Init;
    local_268.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_268.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_268.fUnicodeForm,dt_integer,&local_24c,ver_10,iVar10 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_268);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_268,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x5a5,local_1a8);
      StrX::~StrX(&local_268);
      errSeen = 1;
    }
    else {
      local_258 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar12 = local_148;
      if (local_258 != pcVar12) {
        pcVar8 = local_258;
        if (local_258 == (char *)0x0) {
LAB_0010b7f7:
          if (*pcVar12 == '\0') goto LAB_0010b847;
        }
        else {
          do {
            cVar3 = *pcVar8;
            if (cVar3 == '\0') goto LAB_0010b7f7;
            pcVar8 = pcVar8 + 1;
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar3 == cVar1);
        }
        StrX::StrX(&local_268,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x5a5,local_1a8,local_268.fLocalForm,local_258,local_148);
        StrX::~StrX(&local_268);
        errSeen = 1;
      }
LAB_0010b847:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release(&local_258,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_24c = st_Init;
    local_268.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_268.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_268.fUnicodeForm,dt_integer,&local_24c,ver_10,iVar10 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_268);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_268,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x5a6,local_1c8);
      StrX::~StrX(&local_268);
      errSeen = 1;
    }
    else {
      local_258 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar12 = local_108;
      if (local_258 != pcVar12) {
        pcVar8 = local_258;
        if (local_258 == (char *)0x0) {
LAB_0010b945:
          if (*pcVar12 == '\0') goto LAB_0010b995;
        }
        else {
          do {
            cVar3 = *pcVar8;
            if (cVar3 == '\0') goto LAB_0010b945;
            pcVar8 = pcVar8 + 1;
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar3 == cVar1);
        }
        StrX::StrX(&local_268,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x5a6,local_1c8,local_268.fLocalForm,local_258,local_108);
        StrX::~StrX(&local_268);
        errSeen = 1;
      }
LAB_0010b995:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release(&local_258,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_24c = st_Init;
    local_268.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_268.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_268.fUnicodeForm,dt_integer,&local_24c,ver_10,iVar10 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_268);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_268,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x5a7,local_1e8);
      StrX::~StrX(&local_268);
      errSeen = 1;
    }
    else {
      local_258 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar12 = local_168;
      if (local_258 != pcVar12) {
        pcVar8 = local_258;
        if (local_258 == (char *)0x0) {
LAB_0010ba93:
          if (*pcVar12 == '\0') goto LAB_0010bae3;
        }
        else {
          do {
            cVar3 = *pcVar8;
            if (cVar3 == '\0') goto LAB_0010ba93;
            pcVar8 = pcVar8 + 1;
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar3 == cVar1);
        }
        StrX::StrX(&local_268,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x5a7,local_1e8,local_268.fLocalForm,local_258,local_168);
        StrX::~StrX(&local_268);
        errSeen = 1;
      }
LAB_0010bae3:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release(&local_258,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_24c = st_Init;
    local_268.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_208,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_268.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_208,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_268.fUnicodeForm,dt_integer,&local_24c,ver_10,iVar10 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_268);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_268,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x5a8,local_208);
      StrX::~StrX(&local_268);
      errSeen = 1;
    }
    else {
      local_258 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar12 = local_128;
      if (local_258 != pcVar12) {
        pcVar8 = local_258;
        if (local_258 == (char *)0x0) {
LAB_0010bbe6:
          if (*pcVar12 == '\0') goto LAB_0010bc36;
        }
        else {
          do {
            cVar3 = *pcVar8;
            if (cVar3 == '\0') goto LAB_0010bbe6;
            pcVar8 = pcVar8 + 1;
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar3 == cVar1);
        }
        StrX::StrX(&local_268,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x5a8,local_208,local_268.fLocalForm,local_258,local_128);
        StrX::~StrX(&local_268);
        errSeen = 1;
      }
LAB_0010bc36:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release(&local_258,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    bVar4 = (int)local_220 == 0;
    local_258 = (char *)((ulong)local_258 & 0xffffffff00000000);
    local_268.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_240,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_268.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_240,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_268.fUnicodeForm,dt_integer,(Status *)&local_258,ver_10,bVar4,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_268);
    if (lVar9 == 0) {
      if ((int)local_258 != 6) {
        StrX::StrX(&local_268,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
        pcVar12 = "st_UnknownType";
        if (((ulong)local_258 & 0xffffffff) < 0xb) {
          pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_258 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x5a9,&local_240,local_268.fLocalForm,"st_FOCA0002",pcVar12);
        StrX::~StrX(&local_268);
        goto LAB_0010bd55;
      }
    }
    else {
      StrX::StrX(&local_268,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x5a9,&local_240);
      StrX::~StrX(&local_268);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar9);
LAB_0010bd55:
      errSeen = 1;
    }
    bVar4 = (int)local_220 == 0;
    local_258 = (char *)((ulong)local_258 & 0xffffffff00000000);
    local_268.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_248,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_268.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_248,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_268.fUnicodeForm,dt_integer,(Status *)&local_258,ver_10,bVar4,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_268);
    uVar2 = local_220;
    if (lVar9 == 0) {
      if ((int)local_258 != 6) {
        StrX::StrX(&local_268,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
        pcVar12 = "st_UnknownType";
        if (((ulong)local_258 & 0xffffffff) < 0xb) {
          pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_258 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x5aa,local_248,local_268.fLocalForm,"st_FOCA0002",pcVar12);
        StrX::~StrX(&local_268);
        goto LAB_0010be6a;
      }
    }
    else {
      StrX::StrX(&local_268,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x5aa,local_248);
      StrX::~StrX(&local_268);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar9);
LAB_0010be6a:
      errSeen = 1;
    }
    local_220 = (ulong)((int)uVar2 + 1);
    if ((int)uVar2 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void test_dt_integer()
{
    const XSValue::DataType dt = XSValue::dt_integer;
    bool  toValidate = true;

    const char lex_v_ran_v_1[]="   1234    \n";
    const char lex_v_ran64_v_1[]="+9223372036854775807";
    const char lex_v_ran64_v_2[]="-9223372036854775808";
    const char lex_v_ran64_iv_1[]="+9223372036854775808";
    const char lex_v_ran64_iv_2[]="-9223372036854775809";

    XSValue::XSValue_Data act_v_ran_v_1;   act_v_ran_v_1.fValue.f_long = (int64_t)1234ll;
    XSValue::XSValue_Data act_v_ran64_v_1; act_v_ran64_v_1.fValue.f_long = (int64_t)+9223372036854775807ll;
    XSValue::XSValue_Data act_v_ran64_v_2; act_v_ran64_v_2.fValue.f_long = (int64_t)-9223372036854775808ll;
    XSValue::XSValue_Data act_v_ran32_v_1; act_v_ran32_v_1.fValue.f_long = (int64_t)+2147483647ll;
    XSValue::XSValue_Data act_v_ran32_v_2; act_v_ran32_v_2.fValue.f_long = (int64_t)-2147483648ll;

    const char lex_v_ran64_v_1_canrep[]="9223372036854775807";
    const char lex_v_ran64_v_2_canrep[]="-9223372036854775808";
    const char lex_v_ran64_iv_1_canrep[]="9223372036854775808";
    const char lex_v_ran64_iv_2_canrep[]="-9223372036854775809";

    const char lex_iv_1[]="12b34.456";
    const char lex_iv_2[]="1234b56";

/***
 * 3.3.13.2 Canonical representation
 *
 * The canonical representation for integer is defined by prohibiting certain options from the Lexical
 * representation (3.3.13.1). Specifically,
 * 1. the preceding optional "+" sign is prohibited and
 * 2. leading zeroes are prohibited.
 *
 ***/

    const char data_rawstr_1[]="   +12345   \n";
    const char data_canrep_1[]="12345";
    const char data_rawstr_2[]="00012345";
    const char data_canrep_2[]="12345";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid
     *            range  valid                           true              n/a
     *            range  invalid       n/a
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid
    VALIDATE_TEST(lex_v_ran_v_1    , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran64_v_1  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran64_v_2  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran64_iv_1 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran64_iv_2 , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        ACTVALUE_TEST(lex_v_ran_v_1,    dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);

        ACTVALUE_TEST(lex_v_ran64_v_1 , dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran64_v_1);
        ACTVALUE_TEST(lex_v_ran64_v_2 , dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran64_v_2);
        ACTVALUE_TEST(lex_v_ran64_iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0003, act_v_ran64_v_1);
        ACTVALUE_TEST(lex_v_ran64_iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0003, act_v_ran64_v_1);

        ACTVALUE_TEST(lex_iv_1,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran32_v_1);
        ACTVALUE_TEST(lex_iv_2,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran32_v_1);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid          n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XMLCh         n/a
     *          range  invalid          n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j)? true : false;

        CANREP_TEST(data_rawstr_1,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_1,    DONT_CARE);
        CANREP_TEST(data_rawstr_2,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_2,    XSValue::st_FOCA0002);

        CANREP_TEST(lex_v_ran64_v_1,  dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran64_v_1_canrep,  DONT_CARE);
        CANREP_TEST(lex_v_ran64_v_2,  dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran64_v_2_canrep,  DONT_CARE);
        CANREP_TEST(lex_v_ran64_iv_1, dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran64_iv_1_canrep, DONT_CARE);
        CANREP_TEST(lex_v_ran64_iv_2, dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran64_iv_2_canrep, DONT_CARE);
        CANREP_TEST(lex_iv_1        , dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2        , dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);

    }

}